

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O0

bucket * lookup(char *name)

{
  int iVar1;
  bucket *pbVar2;
  bucket **local_28;
  bucket **bpp;
  bucket *bp;
  char *name_local;
  
  local_28 = symbol_table;
  iVar1 = hash(name);
  local_28 = local_28 + iVar1;
  bpp = &(*local_28)->link;
  while( true ) {
    if (bpp == (bucket **)0x0) {
      pbVar2 = make_bucket(name);
      *local_28 = pbVar2;
      last_symbol->next = pbVar2;
      last_symbol = pbVar2;
      return pbVar2;
    }
    iVar1 = strcmp(name,(char *)bpp[2]);
    if (iVar1 == 0) break;
    local_28 = bpp;
    bpp = &(*bpp)->link;
  }
  return (bucket *)bpp;
}

Assistant:

bucket *lookup(char *name)
{
    register bucket *bp, **bpp;

    bpp = symbol_table + hash(name);
    bp = *bpp;

    while (bp)
    {
	if (strcmp(name, bp->name) == 0) return (bp);
	bpp = &bp->link;
	bp = *bpp;
    }

    *bpp = bp = make_bucket(name);
    last_symbol->next = bp;
    last_symbol = bp;

    return (bp);
}